

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_string_field_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableStringOneofFieldLiteGenerator::GenerateParsingCode
          (ImmutableStringOneofFieldLiteGenerator *this,Printer *printer)

{
  bool bVar1;
  Printer *printer_local;
  ImmutableStringOneofFieldLiteGenerator *this_local;
  
  bVar1 = CheckUtf8((this->super_ImmutableStringFieldLiteGenerator).descriptor_);
  if (bVar1) {
    io::Printer::Print(printer,&(this->super_ImmutableStringFieldLiteGenerator).variables_,
                       "String s = input.readStringRequireUtf8();\n$set_oneof_case_message$;\n$oneof_name$_ = s;\n"
                      );
  }
  else {
    io::Printer::Print(printer,&(this->super_ImmutableStringFieldLiteGenerator).variables_,
                       "String s = input.readString();\n$set_oneof_case_message$;\n$oneof_name$_ = s;\n"
                      );
  }
  return;
}

Assistant:

void ImmutableStringOneofFieldLiteGenerator::
GenerateParsingCode(io::Printer* printer) const {
  if (CheckUtf8(descriptor_)) {
    printer->Print(variables_,
      "String s = input.readStringRequireUtf8();\n"
      "$set_oneof_case_message$;\n"
      "$oneof_name$_ = s;\n");
  } else {
    // Lite runtime should attempt to reduce allocations by attempting to
    // construct the string directly from the input stream buffer. This avoids
    // spurious intermediary ByteString allocations, cutting overall allocations
    // in half.
    printer->Print(variables_,
      "String s = input.readString();\n"
      "$set_oneof_case_message$;\n"
      "$oneof_name$_ = s;\n");
  }
}